

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_coordinator_unittest.cpp
# Opt level: O0

void __thiscall HostCoordinator_overlap_Test::TestBody(HostCoordinator_overlap_Test *this)

{
  HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_> *this_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_458;
  AssertHelper local_438;
  Message local_430;
  size_type local_428 [2];
  array_reference_type local_418;
  undefined8 local_3f8;
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_3f0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_3a8;
  Message local_3a0 [2];
  undefined8 local_390;
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_388;
  size_type local_370 [2];
  array_reference_type local_360;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_318;
  Message local_310 [2];
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_300;
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_2e0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_298;
  Message local_290 [2];
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_280;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_238;
  Message local_230 [2];
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_220;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_198;
  Message local_190;
  size_type local_188 [2];
  array_reference_type local_178;
  undefined8 local_158;
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_150;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_108;
  Message local_100 [2];
  undefined8 local_f0;
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_e8;
  size_type local_d0 [2];
  array_reference_type local_c0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  undefined1 local_48 [8];
  view_type rng_other;
  view_type rng;
  intcoord_t coordinator;
  int N;
  HostCoordinator_overlap_Test *this_local;
  
  rng.size_._4_4_ = 0x14;
  this_00 = (HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_> *)
            ((long)&rng.size_ + 3);
  memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>::allocate
            ((view_type *)&rng_other.size_,this_00,0x14);
  memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>::allocate
            ((view_type *)local_48,this_00,0x14);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>&,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&rng_other.size_,
                     (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                      *)local_48);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_68,(bool)(~bVar1 & 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_68,
               (AssertionResult *)"rng.overlaps(rng_other)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_d0[1] = 0;
  local_d0[0] = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_c0,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,local_d0 + 1,local_d0);
  local_f0 = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_e8,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,&local_f0);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&local_c0,&local_e8);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_a8,(bool)(~bVar1 & 1));
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_e8);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_a8,
               (AssertionResult *)"rng(0,10).overlaps(rng(10,end))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_158 = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_150,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,&local_158);
  local_188[1] = 0;
  local_188[0] = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_178,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,local_188 + 1,local_188);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&local_150,&local_178);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_138,(bool)(~bVar1 & 1));
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_178);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_138,
               (AssertionResult *)"rng(10,end).overlaps(rng(0,10))","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>&,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&rng_other.size_,
                     (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                      *)&rng_other.size_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_1c8,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1c8,
               (AssertionResult *)"rng.overlaps(rng)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_220,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>&,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&local_220,
                     (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                      *)&rng_other.size_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_208,bVar1);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_208,
               (AssertionResult *)"rng(all).overlaps(rng)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_280,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&rng_other.size_,&local_280);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_268,bVar1);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_268,
               (AssertionResult *)"rng.overlaps(rng(all))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_2e0,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_300,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&local_2e0,&local_300);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_2c8,bVar1);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_300);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2c8,
               (AssertionResult *)"rng(all).overlaps(rng(all))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_370[1] = 0;
  local_370[0] = 0xb;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_360,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,local_370 + 1,local_370);
  local_390 = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_388,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,&local_390);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&local_360,&local_388);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_348,bVar1);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_388);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_348,
               (AssertionResult *)"rng(0,11).overlaps(rng(10,end))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_3f8 = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_3f0,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,&local_3f8);
  local_428[1] = 0;
  local_428[0] = 0xb;
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&local_418,
               (ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&rng_other.size_,local_428 + 1,local_428);
  bVar1 = memory::
          ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,std::enable_if<true,void>>
                    ((ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)&local_3f0,&local_418);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_3d8,bVar1);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_418);
  memory::
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference(&local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_458,(internal *)local_3d8,(AssertionResult *)"rng(10,end).overlaps(rng(0,11))"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_coordinator_unittest.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayViewImpl((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                    *)local_48);
  memory::
  ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayViewImpl((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                    *)&rng_other.size_);
  return;
}

Assistant:

TEST(HostCoordinator, overlap) {
    using namespace memory;

    const int N = 20;

    typedef HostCoordinator<int> intcoord_t;
    intcoord_t coordinator;

    auto rng = coordinator.allocate(N);
    auto rng_other = coordinator.allocate(N);
    EXPECT_FALSE(rng.overlaps(rng_other));
    EXPECT_FALSE(rng(0,10).overlaps(rng(10,end)));
    EXPECT_FALSE(rng(10,end).overlaps(rng(0,10)));

    EXPECT_TRUE(rng.overlaps(rng));
    EXPECT_TRUE(rng(all).overlaps(rng));
    EXPECT_TRUE(rng.overlaps(rng(all)));
    EXPECT_TRUE(rng(all).overlaps(rng(all)));
    EXPECT_TRUE(rng(0,11).overlaps(rng(10,end)));
    EXPECT_TRUE(rng(10,end).overlaps(rng(0,11)));
}